

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzeuleranalysis.cpp
# Opt level: O3

void __thiscall
TPZEulerAnalysis::TPZEulerAnalysis(TPZEulerAnalysis *this,TPZFlowCompMesh *mesh,ostream *out)

{
  TPZLinearAnalysis::TPZLinearAnalysis
            (&this->super_TPZLinearAnalysis,&PTR_PTR_0196bc00,&mesh->super_TPZCompMesh,true,out);
  (this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZEulerAnalysis_0196bae0;
  this->fFlowCompMesh = mesh;
  (this->fRhsLast).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fRhsLast).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fRhsLast).super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fRhsLast).super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fRhsLast).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  (this->fRhsLast).fElem = (double *)0x0;
  (this->fRhsLast).fGiven = (double *)0x0;
  (this->fRhsLast).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fRhsLast).fPivot.super_TPZVec<int>,0);
  (this->fRhsLast).fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498
  ;
  (this->fRhsLast).fPivot.super_TPZVec<int>.fStore = (this->fRhsLast).fPivot.fExtAlloc;
  (this->fRhsLast).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fRhsLast).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fRhsLast).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  (this->fRhsLast).fWork.fStore = (double *)0x0;
  (this->fRhsLast).fWork.fNElements = 0;
  (this->fRhsLast).fWork.fNAlloc = 0;
  this->fNewtonEps = 1e-09;
  this->fNewtonMaxIter = 10;
  this->fTimeIntEps = 1e-08;
  this->fTimeIntMaxIter = 100;
  this->fEvolCFL = 0;
  this->fpBlockDiag = (TPZBlockDiagonal<double> *)0x0;
  this->fHasFrontalPreconditioner = 0;
  return;
}

Assistant:

TPZEulerAnalysis::TPZEulerAnalysis(TPZFlowCompMesh *mesh, std::ostream &out):
TPZLinearAnalysis(mesh, true, out), fFlowCompMesh(mesh),
fRhsLast(),
fNewtonEps(1e-9),  fNewtonMaxIter(10),
fTimeIntEps(1e-8), fTimeIntMaxIter(100),
fEvolCFL(0), fpBlockDiag(NULL),fHasFrontalPreconditioner(0)
{
	
}